

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O1

REF_STATUS
ref_inflate_face(REF_GRID ref_grid,REF_DICT faceids,REF_DBL *origin,REF_DBL thickness,REF_DBL xshift
                )

{
  double *pdVar1;
  REF_DBL *pRVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  REF_MPI pRVar8;
  REF_CELL pRVar9;
  REF_DBL *pRVar10;
  REF_ADJ pRVar11;
  REF_ADJ_ITEM pRVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  undefined4 uVar15;
  void *pvVar16;
  REF_STATUS RVar17;
  uint uVar18;
  REF_BOOL RVar19;
  void *__ptr;
  long lVar20;
  void *__s;
  ulong uVar21;
  long lVar22;
  undefined8 uVar23;
  REF_INT RVar24;
  ulong uVar25;
  char *pcVar26;
  char *pcVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  double dVar31;
  double dVar32;
  REF_INT new_node;
  REF_INT new_cell;
  REF_INT tris [2];
  REF_DBL normal [3];
  REF_DBL y1;
  REF_DBL y0;
  REF_DBL temp;
  REF_INT nquad;
  REF_INT ntri;
  REF_INT nodes [27];
  REF_DBL min_dot;
  REF_GLOB global;
  REF_INT quads [2];
  REF_INT new_nodes [27];
  REF_INT ref_nodes [27];
  uint local_290;
  REF_INT local_28c;
  REF_NODE local_288;
  REF_CELL local_280;
  void *local_278;
  REF_DICT local_270;
  int local_264;
  undefined8 local_260;
  REF_DBL *local_258;
  void *local_250;
  void *local_248;
  REF_INT local_23c;
  REF_DBL local_238;
  int local_230;
  int local_22c;
  REF_DBL local_228;
  double local_220;
  double local_218;
  double local_208;
  double local_200;
  undefined1 local_1f8 [16];
  REF_CELL local_1e8;
  double local_1e0;
  REF_MPI local_1d8;
  undefined8 uStack_1d0;
  void *local_1c8;
  REF_DBL local_1c0;
  int local_1b8;
  int local_1b4;
  REF_GRID local_1b0;
  int local_1a8 [3];
  REF_INT local_19c;
  REF_CELL local_138;
  double local_130;
  REF_GLOB local_128;
  int local_120 [2];
  int local_118;
  int local_114;
  int local_110;
  undefined4 local_10c;
  REF_INT local_108;
  undefined4 local_104;
  REF_INT local_a8 [3];
  REF_INT local_9c;
  
  local_1f8._8_8_ = local_1f8._0_8_;
  pRVar8 = ref_grid->mpi;
  local_288 = ref_grid->node;
  pRVar9 = ref_grid->cell[3];
  local_1e8 = ref_grid->cell[6];
  local_138 = ref_grid->cell[10];
  uVar21 = (ulong)(uint)faceids->n;
  local_270 = faceids;
  local_258 = origin;
  local_238 = xshift;
  local_1c0 = thickness;
  if (faceids->n < 0) {
    local_290 = 1;
    pcVar27 = "malloc face_normal of REF_DBL negative";
LAB_00194b28:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x73,
           "ref_inflate_face",pcVar27);
    local_248 = (void *)0x0;
  }
  else {
    local_290 = (uint)(uVar21 * 3);
    local_248 = malloc(uVar21 * 0x18);
    if (local_248 == (void *)0x0) {
      local_290 = 2;
      pcVar27 = "malloc face_normal of REF_DBL NULL";
      goto LAB_00194b28;
    }
    bVar14 = true;
    if (uVar21 != 0) {
      uVar25 = 1;
      if (1 < (int)local_290) {
        uVar25 = uVar21 * 3 & 0xffffffff;
      }
      uVar21 = 0;
      do {
        *(undefined8 *)((long)local_248 + uVar21 * 8) = 0xbff0000000000000;
        uVar21 = uVar21 + 1;
      } while (uVar25 != uVar21);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  iVar28 = local_270->n;
  lVar29 = (long)iVar28;
  local_280 = pRVar9;
  local_1d8 = pRVar8;
  if (lVar29 < 0) {
    local_290 = 1;
    pcVar27 = "malloc ymin of REF_DBL negative";
LAB_00194bcc:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x77,
           "ref_inflate_face",pcVar27);
    __ptr = (void *)0x0;
  }
  else {
    __ptr = malloc(lVar29 * 8);
    if (__ptr == (void *)0x0) {
      local_290 = 2;
      pcVar27 = "malloc ymin of REF_DBL NULL";
      goto LAB_00194bcc;
    }
    bVar14 = true;
    if (iVar28 != 0) {
      lVar20 = 0;
      do {
        *(undefined8 *)((long)__ptr + lVar20 * 8) = 0x6974e718d7d7625a;
        lVar20 = lVar20 + 1;
      } while (lVar29 != lVar20);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  iVar28 = local_270->n;
  lVar29 = (long)iVar28;
  if (lVar29 < 0) {
    local_290 = 1;
    pcVar27 = "malloc ymax of REF_DBL negative";
LAB_00194c5c:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x78,
           "ref_inflate_face",pcVar27);
    local_278 = (void *)0x0;
  }
  else {
    local_278 = malloc(lVar29 * 8);
    if (local_278 == (void *)0x0) {
      local_290 = 2;
      pcVar27 = "malloc ymax of REF_DBL NULL";
      goto LAB_00194c5c;
    }
    bVar14 = true;
    if (iVar28 != 0) {
      lVar20 = 0;
      do {
        *(undefined8 *)((long)local_278 + lVar20 * 8) = 0xe974e718d7d7625a;
        lVar20 = lVar20 + 1;
      } while (lVar29 != lVar20);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  iVar28 = local_270->n;
  lVar29 = (long)iVar28;
  if (lVar29 < 0) {
    local_290 = 1;
    pcVar27 = "malloc orient of REF_DBL negative";
LAB_00194cf3:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x79,
           "ref_inflate_face",pcVar27);
    local_1f8._0_8_ = (void *)0x0;
  }
  else {
    local_1f8._0_8_ = malloc(lVar29 * 8);
    if ((void *)local_1f8._0_8_ == (void *)0x0) {
      local_290 = 2;
      pcVar27 = "malloc orient of REF_DBL NULL";
      goto LAB_00194cf3;
    }
    bVar14 = true;
    if (iVar28 != 0) {
      lVar20 = 0;
      do {
        *(undefined8 *)(local_1f8._0_8_ + lVar20 * 8) = 0x3ff0000000000000;
        lVar20 = lVar20 + 1;
      } while (lVar29 != lVar20);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  local_200 = 1e+200;
  local_208 = -1e+200;
  local_1b0 = ref_grid;
  if (0 < local_280->max) {
    iVar28 = 0;
    do {
      RVar17 = ref_cell_nodes(local_280,iVar28,local_1a8);
      if ((RVar17 == 0) && (RVar19 = ref_dict_has_key(local_270,local_19c), RVar19 != 0)) {
        lVar29 = 0;
        do {
          uVar18 = ref_dict_location(local_270,local_19c,&local_28c);
          if (uVar18 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0x80,"ref_inflate_face",(ulong)uVar18,"key loc");
            return uVar18;
          }
          dVar32 = local_288->real[(long)local_1a8[lVar29] * 0xf + 1] - local_258[1];
          lVar20 = (long)local_28c;
          if (dVar32 < *(double *)((long)__ptr + lVar20 * 8)) {
            *(double *)((long)__ptr + lVar20 * 8) = dVar32;
          }
          pdVar1 = (double *)((long)local_278 + lVar20 * 8);
          if (*pdVar1 <= dVar32 && dVar32 != *pdVar1) {
            *(double *)((long)local_278 + lVar20 * 8) = dVar32;
          }
          if (dVar32 < local_200) {
            local_200 = dVar32;
          }
          if (local_208 < dVar32) {
            local_208 = dVar32;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
      }
      iVar28 = iVar28 + 1;
    } while (iVar28 < local_280->max);
  }
  local_1e0 = local_200;
  uVar18 = ref_mpi_min(local_1d8,&local_1e0,&local_200,3);
  pRVar8 = local_1d8;
  if (uVar18 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x93,
           "ref_inflate_face",(ulong)uVar18,"max thresh");
    return uVar18;
  }
  uVar18 = ref_mpi_bcast(local_1d8,&local_200,1,3);
  if (uVar18 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x94,
           "ref_inflate_face",(ulong)uVar18,"bcast");
    return uVar18;
  }
  local_1e0 = local_208;
  uVar18 = ref_mpi_max(pRVar8,&local_1e0,&local_208,3);
  if (uVar18 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x96,
           "ref_inflate_face",(ulong)uVar18,"max thresh");
    return uVar18;
  }
  uVar18 = ref_mpi_bcast(pRVar8,&local_208,1,3);
  if (uVar18 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x97,
           "ref_inflate_face",(ulong)uVar18,"bcast");
    local_290 = uVar18;
  }
  pcVar27 = (char *)(ulong)local_290;
  if (uVar18 != 0) {
    return local_290;
  }
  local_28c = 0;
  uVar18 = local_270->n;
  if (0 < (int)uVar18) {
    do {
      pdVar1 = (double *)((long)__ptr + (long)local_28c * 8);
      local_1e0 = *pdVar1;
      uVar18 = ref_mpi_min(pRVar8,&local_1e0,pdVar1,3);
      if (uVar18 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x9c,"ref_inflate_face",(ulong)uVar18,"max thresh");
        return uVar18;
      }
      uVar18 = ref_mpi_bcast(pRVar8,(void *)((long)__ptr + (long)local_28c * 8),1,3);
      if (uVar18 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x9d,"ref_inflate_face",(ulong)uVar18,"bcast");
        return uVar18;
      }
      pdVar1 = (double *)((long)local_278 + (long)local_28c * 8);
      local_1e0 = *pdVar1;
      uVar18 = ref_mpi_max(pRVar8,&local_1e0,pdVar1,3);
      if (uVar18 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x9f,"ref_inflate_face",(ulong)uVar18,"max thresh");
        return uVar18;
      }
      uVar18 = ref_mpi_bcast(pRVar8,(void *)((long)local_278 + (long)local_28c * 8),1,3);
      if (uVar18 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0xa0,"ref_inflate_face",(ulong)uVar18,"bcast");
        return uVar18;
      }
      lVar29 = (long)local_28c;
      *(undefined8 *)(local_1f8._0_8_ + lVar29 * 8) =
           *(undefined8 *)
            (&DAT_00244e50 +
            (ulong)(*(double *)((long)__ptr + lVar29 * 8) - local_200 <
                   local_208 - *(double *)((long)local_278 + lVar29 * 8)) * 8);
      local_28c = local_28c + 1;
      uVar18 = local_270->n;
    } while (local_28c < (int)uVar18);
  }
  if ((int)uVar18 < 0) {
    local_290 = 1;
    pcVar26 = "malloc tmin of REF_DBL negative";
LAB_00195279:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0xa9,
           "ref_inflate_face",pcVar26);
    local_1c8 = (void *)0x0;
  }
  else {
    local_1c8 = malloc((ulong)uVar18 * 8);
    if (local_1c8 == (void *)0x0) {
      local_290 = 2;
      pcVar26 = "malloc tmin of REF_DBL NULL";
      goto LAB_00195279;
    }
    bVar14 = true;
    if (uVar18 != 0) {
      uVar21 = 0;
      do {
        *(undefined8 *)((long)local_1c8 + uVar21 * 8) = 0x402921fb54442d11;
        uVar21 = uVar21 + 1;
      } while (uVar18 != uVar21);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  iVar28 = local_270->n;
  lVar29 = (long)iVar28;
  if (lVar29 < 0) {
    local_290 = 1;
    pcVar26 = "malloc tmax of REF_DBL negative";
LAB_00195317:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0xaa,
           "ref_inflate_face",pcVar26);
    __s = (void *)0x0;
  }
  else {
    __s = malloc(lVar29 * 8);
    if (__s == (void *)0x0) {
      local_290 = 2;
      pcVar26 = "malloc tmax of REF_DBL NULL";
      goto LAB_00195317;
    }
    bVar14 = true;
    if (iVar28 != 0) {
      lVar20 = 0;
      do {
        *(undefined8 *)((long)__s + lVar20 * 8) = 0xc02921fb54442d11;
        lVar20 = lVar20 + 1;
      } while (lVar29 != lVar20);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  iVar28 = local_270->n;
  local_260 = __s;
  if ((long)iVar28 < 0) {
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0xab,
           "ref_inflate_face","malloc imin of REF_INT negative");
    local_290 = 1;
  }
  else {
    sVar3 = (long)iVar28 * 4;
    local_250 = malloc(sVar3);
    if (local_250 == (void *)0x0) {
      bVar14 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0xab,"ref_inflate_face","malloc imin of REF_INT NULL");
      local_290 = 2;
      local_250 = (void *)0x0;
    }
    else {
      bVar14 = true;
      if (iVar28 != 0) {
        memset(local_250,0xff,sVar3);
      }
    }
  }
  if (!bVar14) {
    return local_290;
  }
  iVar28 = local_270->n;
  if ((long)iVar28 < 0) {
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0xac,
           "ref_inflate_face","malloc imax of REF_INT negative");
    local_290 = 1;
  }
  else {
    sVar3 = (long)iVar28 * 4;
    __s = malloc(sVar3);
    if (__s == (void *)0x0) {
      bVar14 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0xac,"ref_inflate_face","malloc imax of REF_INT NULL");
      local_290 = 2;
      __s = (void *)0x0;
    }
    else {
      bVar14 = true;
      if (iVar28 != 0) {
        memset(__s,0xff,sVar3);
      }
    }
  }
  pvVar16 = local_1c8;
  if (!bVar14) {
    return local_290;
  }
  if (0 < local_280->max) {
    RVar24 = 0;
    do {
      RVar17 = ref_cell_nodes(local_280,RVar24,local_1a8);
      if ((RVar17 == 0) && (RVar19 = ref_dict_has_key(local_270,local_19c), RVar19 != 0)) {
        lVar29 = 0;
        do {
          uVar18 = ref_dict_location(local_270,local_19c,&local_28c);
          if (uVar18 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0xb1,"ref_inflate_face",(ulong)uVar18,"key loc");
            return uVar18;
          }
          iVar28 = local_1a8[lVar29];
          dVar32 = atan2(local_288->real[(long)iVar28 * 0xf + 2] - local_258[2],
                         (local_288->real[(long)iVar28 * 0xf + 1] - local_258[1]) *
                         *(double *)(local_1f8._0_8_ + (long)local_28c * 8));
          lVar20 = (long)local_28c;
          if (dVar32 < *(double *)((long)pvVar16 + lVar20 * 8)) {
            *(double *)((long)pvVar16 + lVar20 * 8) = dVar32;
            *(int *)((long)local_250 + lVar20 * 4) = iVar28;
          }
          pdVar1 = (double *)((long)local_260 + lVar20 * 8);
          if (*pdVar1 <= dVar32 && dVar32 != *pdVar1) {
            *(double *)((long)local_260 + lVar20 * 8) = dVar32;
            *(int *)((long)__s + lVar20 * 4) = iVar28;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != 3);
        pcVar27 = (char *)0x3;
      }
      RVar24 = RVar24 + 1;
    } while (RVar24 < local_280->max);
  }
  local_28c = 0;
  if (0 < local_270->n) {
    pcVar27 = "ref_inflate_face";
    do {
      lVar29 = (long)local_28c;
      if (local_1d8->n < 2) {
        if (*(int *)((long)local_250 + lVar29 * 4) == -1) {
          pcVar27 = "imin";
          uVar23 = 199;
        }
        else {
          if (*(int *)((long)__s + lVar29 * 4) != -1) goto LAB_00195651;
          pcVar27 = "imax";
          uVar23 = 0xc9;
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               uVar23,"ref_inflate_face",pcVar27);
        printf("empty %d: %d \n",(long)local_28c,(ulong)(uint)local_270->key[local_28c]);
        goto LAB_00195add;
      }
LAB_00195651:
      lVar20 = (long)*(int *)((long)local_250 + lVar29 * 4);
      if ((lVar20 != -1) && (lVar22 = (long)*(int *)((long)__s + lVar29 * 4), lVar22 != -1)) {
        pRVar2 = (REF_DBL *)((long)local_248 + (long)(local_28c * 3) * 8);
        *pRVar2 = 0.0;
        pRVar10 = local_288->real;
        dVar32 = pRVar10[lVar22 * 0xf + 2];
        dVar31 = pRVar10[lVar20 * 0xf + 2];
        pRVar2[1] = dVar32 - dVar31;
        dVar4 = pRVar10[lVar22 * 0xf + 1];
        dVar5 = pRVar10[lVar20 * 0xf + 1];
        pRVar2[2] = -(dVar4 - dVar5);
        dVar6 = *(double *)(local_1f8._0_8_ + lVar29 * 8);
        pRVar2[1] = -dVar6 * (dVar32 - dVar31);
        pRVar2[2] = (dVar4 - dVar5) * dVar6;
        uVar18 = ref_math_normalize(pRVar2);
        if (uVar18 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                 ,0xd6,"ref_inflate_face",(ulong)uVar18,"make face norm");
          return uVar18;
        }
      }
      local_28c = local_28c + 1;
    } while (local_28c < local_270->n);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (local_250 != (void *)0x0) {
    free(local_250);
  }
  if (local_260 != (void *)0x0) {
    free(local_260);
  }
  if (local_1c8 != (void *)0x0) {
    free(local_1c8);
  }
  if ((void *)local_1f8._0_8_ != (void *)0x0) {
    free((void *)local_1f8._0_8_);
  }
  if (local_278 != (void *)0x0) {
    free(local_278);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  iVar28 = local_288->max;
  lVar29 = (long)iVar28;
  if (lVar29 < 0) {
    local_290 = 1;
    pcVar26 = "malloc o2n of REF_INT negative";
LAB_00195842:
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0xec,
           "ref_inflate_face",pcVar26);
    local_278 = (void *)0x0;
  }
  else {
    local_278 = malloc(lVar29 * 4);
    if (local_278 == (void *)0x0) {
      local_290 = 2;
      pcVar26 = "malloc o2n of REF_INT NULL";
      local_278 = (void *)0x0;
      goto LAB_00195842;
    }
    bVar14 = true;
    if (0 < local_288->max) {
      lVar20 = 0;
      do {
        *(undefined4 *)((long)local_278 + lVar20 * 4) = 0xffffffff;
        lVar20 = lVar20 + 1;
      } while (lVar20 < local_288->max);
    }
  }
  if (!bVar14) {
    return local_290;
  }
  if (0 < local_280->max) {
    iVar30 = 0;
    do {
      RVar17 = ref_cell_nodes(local_280,iVar30,local_1a8);
      if ((RVar17 == 0) && (RVar19 = ref_dict_has_key(local_270,local_19c), RVar19 != 0)) {
        lVar20 = 0;
        do {
          pcVar27 = (char *)(long)local_1a8[lVar20];
          if ((local_288->ref_mpi->id == local_288->part[(long)pcVar27]) &&
             (*(int *)((long)local_278 + (long)pcVar27 * 4) == -1)) {
            uVar18 = ref_node_next_global(local_288,&local_128);
            if (uVar18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0xf4,"ref_inflate_face",(ulong)uVar18,"global");
              return uVar18;
            }
            uVar18 = ref_node_add(local_288,local_128,&local_264);
            if (uVar18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0xf5,"ref_inflate_face",(ulong)uVar18,"add node");
              return uVar18;
            }
            local_288->part[local_264] = local_1d8->id;
            *(int *)((long)local_278 + (long)pcVar27 * 4) = local_264;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 3);
      }
      iVar30 = iVar30 + 1;
    } while (iVar30 < local_280->max);
  }
  uVar18 = ref_node_shift_new_globals(local_288);
  if (uVar18 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0xff,
           "ref_inflate_face",(ulong)uVar18,"shift glob");
    return uVar18;
  }
  iVar30 = local_288->max;
  if ((long)iVar30 < 0) {
    bVar14 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x101
           ,"ref_inflate_face","malloc o2g of REF_GLOB negative");
    local_290 = 1;
  }
  else {
    sVar3 = (long)iVar30 * 8;
    pcVar27 = (char *)malloc(sVar3);
    if ((REF_GLOB *)pcVar27 == (REF_GLOB *)0x0) {
      bVar14 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x101,"ref_inflate_face","malloc o2g of REF_GLOB NULL");
      local_290 = 2;
      pcVar27 = (char *)0x0;
    }
    else {
      bVar14 = true;
      if (iVar30 != 0) {
        memset(pcVar27,0xff,sVar3);
      }
    }
  }
  if (!bVar14) {
    return local_290;
  }
  if (0 < iVar28) {
    lVar20 = 0;
    do {
      uVar18 = *(uint *)((long)local_278 + lVar20 * 4);
      if ((ulong)uVar18 != 0xffffffff) {
        lVar22 = -1;
        if (((-1 < (int)uVar18) && ((int)uVar18 < local_288->max)) &&
           (lVar22 = local_288->global[uVar18], lVar22 < 0)) {
          lVar22 = -1;
        }
        *(long *)((long)pcVar27 + lVar20 * 8) = lVar22;
      }
      lVar20 = lVar20 + 1;
    } while (lVar29 != lVar20);
  }
  uVar18 = ref_node_ghost_glob(local_288,(REF_GLOB *)pcVar27,1);
  if (uVar18 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x109
           ,"ref_inflate_face",(ulong)uVar18,"update ghosts");
    return uVar18;
  }
  if (local_278 != (void *)0x0) {
    free(local_278);
  }
  iVar28 = local_288->max;
  lVar29 = (long)iVar28;
  if (lVar29 < 0) {
    local_290 = 1;
    pcVar26 = "malloc o2n of REF_INT negative";
  }
  else {
    local_278 = malloc(lVar29 * 4);
    if (local_278 != (void *)0x0) {
      bVar14 = true;
      if (0 < local_288->max) {
        lVar20 = 0;
        do {
          *(undefined4 *)((long)local_278 + lVar20 * 4) = 0xffffffff;
          lVar20 = lVar20 + 1;
        } while (lVar20 < local_288->max);
      }
      goto LAB_00195cb2;
    }
    local_290 = 2;
    pcVar26 = "malloc o2n of REF_INT NULL";
    local_278 = (void *)0x0;
  }
  bVar14 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x10d,
         "ref_inflate_face",pcVar26);
LAB_00195cb2:
  uVar18 = local_290;
  if (bVar14) {
    if (0 < iVar28) {
      lVar20 = 0;
      do {
        if (*(long *)((long)pcVar27 + lVar20 * 8) != -1) {
          uVar18 = ref_node_add(local_288,*(long *)((long)pcVar27 + lVar20 * 8),&local_264);
          if (uVar18 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0x112,"ref_inflate_face",(ulong)uVar18,"add node");
            return uVar18;
          }
          local_288->part[local_264] = local_288->part[lVar20];
          *(int *)((long)local_278 + lVar20 * 4) = local_264;
        }
        lVar20 = lVar20 + 1;
      } while (lVar29 != lVar20);
    }
    if (iVar28 < 1) {
      local_260 = (void *)((ulong)local_260._4_4_ << 0x20);
    }
    else {
      lVar20 = 0;
      local_260 = (void *)((ulong)local_260._4_4_ << 0x20);
      do {
        if (((lVar20 < local_288->max) && (-1 < local_288->global[lVar20])) &&
           ((local_288->ref_mpi->id == local_288->part[lVar20] &&
            (iVar28 = *(int *)((long)local_278 + lVar20 * 4), iVar28 != -1)))) {
          local_228 = 0.0;
          local_220 = local_288->real[lVar20 * 0xf + 1] - local_258[1];
          local_218 = local_288->real[lVar20 * 0xf + 2] - local_258[2];
          local_264 = iVar28;
          uVar18 = ref_math_normalize(&local_228);
          if (uVar18 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0x120,"ref_inflate_face",(ulong)uVar18,"make norm");
            return uVar18;
          }
          pRVar11 = local_280->ref_adj;
          RVar24 = -1;
          uVar21 = 0xffffffff;
          if (lVar20 < pRVar11->nnode) {
            uVar21 = (ulong)(uint)pRVar11->first[lVar20];
          }
          if ((int)uVar21 != -1) {
            RVar24 = pRVar11->item[(int)uVar21].ref;
          }
          while ((int)uVar21 != -1) {
            uVar18 = ref_cell_nodes(local_280,RVar24,local_a8);
            if (uVar18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0x122,"ref_inflate_face",(ulong)uVar18,"cell");
              return uVar18;
            }
            RVar19 = ref_dict_has_key(local_270,local_9c);
            if (RVar19 != 0) {
              uVar18 = ref_dict_location(local_270,local_9c,&local_28c);
              if (uVar18 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                       ,0x124,"ref_inflate_face",(ulong)uVar18,"key loc");
                return uVar18;
              }
              lVar22 = (long)local_28c;
              dVar32 = *(double *)((long)local_248 + lVar22 * 0x18);
              if (dVar32 <= -0.1) {
                pcVar27 = "uninitialized face_normal";
                uVar23 = 0x126;
                goto LAB_001969ff;
              }
              local_1d8 = (REF_MPI)(local_218 * *(double *)((long)local_248 + lVar22 * 0x18 + 0x10)
                                   + dVar32 * local_228 +
                                     local_220 * *(double *)((long)local_248 + lVar22 * 0x18 + 8));
              uVar25 = (ulong)local_1d8 ^ (ulong)DAT_00238100;
              auVar13._8_4_ = DAT_00238100._8_4_;
              auVar13._0_8_ = uVar25;
              auVar13._12_4_ = DAT_00238100._12_4_;
              uStack_1d0 = 0;
              local_1f8 = auVar13;
              if ((-0.7 < (double)local_1d8) || ((double)local_1d8 < -1.01)) {
                pRVar2 = local_288->real;
                local_1f8._0_4_ = (undefined4)uVar25;
                uVar15 = local_1f8._0_4_;
                printf("out-of-range dot %.15f at %f %f %f\n",uVar15,pRVar2[lVar20 * 0xf],
                       pRVar2[lVar20 * 0xf + 1],pRVar2[lVar20 * 0xf + 2]);
                local_260 = (void *)CONCAT44(local_260._4_4_,1);
              }
              dVar32 = (double)local_1d8 * -1e+20;
              if (dVar32 <= -dVar32) {
                dVar32 = -dVar32;
              }
              dVar31 = local_220;
              if (local_220 <= -local_220) {
                dVar31 = -local_220;
              }
              if (dVar32 <= dVar31) {
                pcVar27 = "normal[1] /= dot";
                uVar23 = 0x136;
              }
              else {
                dVar31 = local_218;
                if (local_218 <= -local_218) {
                  dVar31 = -local_218;
                }
                if (dVar31 < dVar32) {
                  local_220 = local_220 / (double)local_1f8._0_8_;
                  local_218 = local_218 / (double)local_1f8._0_8_;
                  goto LAB_00196095;
                }
                pcVar27 = "normal[2] /= dot";
                uVar23 = 0x13f;
              }
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,uVar23,"ref_inflate_face",pcVar27);
              printf("dot %e\n",local_1f8._0_4_);
              pRVar2 = local_288->real;
              printf(" xyz %f %f %f\n",SUB84(pRVar2[lVar20 * 0xf & 0xffffffff],0),
                     pRVar2[lVar20 * 0xf + 1],pRVar2[lVar20 * 0xf + 2]);
              printf(" norm %f %f %f\n",SUB84(local_228,0),local_220,local_218);
              printf("%d face norm %f %f %f\n",
                     (int)*(undefined8 *)((long)local_248 + (long)local_28c * 0x18),
                     *(undefined8 *)((long)local_248 + (long)(local_28c * 3) * 8 + 8),
                     *(undefined8 *)((long)local_248 + (long)(local_28c * 3) * 8 + 0x10));
              goto LAB_00195add;
            }
LAB_00196095:
            pRVar12 = local_280->ref_adj->item;
            uVar21 = (ulong)pRVar12[(int)uVar21].next;
            if (uVar21 == 0xffffffffffffffff) {
              RVar24 = -1;
            }
            else {
              RVar24 = pRVar12[uVar21].ref;
            }
          }
          pRVar2 = local_288->real;
          lVar22 = (long)local_264;
          pRVar2[lVar22 * 0xf] = pRVar2[lVar20 * 0xf] + local_238;
          pRVar2[lVar22 * 0xf + 1] = local_220 * local_1c0 + pRVar2[lVar20 * 0xf + 1];
          pRVar2[lVar22 * 0xf + 2] = local_218 * local_1c0 + pRVar2[lVar20 * 0xf + 2];
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != lVar29);
    }
    if ((int)local_260 != 0) {
      puts("ERROR: new node normal");
    }
    uVar18 = ref_node_ghost_real(local_288);
    if (uVar18 == 0) {
      if (local_248 != (void *)0x0) {
        free(local_248);
      }
      if (0 < local_280->max) {
        local_238 = (REF_DBL)((ulong)local_238 & 0xffffffff00000000);
        do {
          RVar17 = ref_cell_nodes(local_280,local_238._0_4_,local_1a8);
          if ((RVar17 == 0) && (RVar19 = ref_dict_has_key(local_270,local_19c), RVar19 != 0)) {
            local_1c0 = (REF_DBL)(long)local_238._0_4_;
            lVar29 = 0;
            do {
              lVar20 = (long)local_280->size_per * (long)local_1c0;
              iVar28 = local_280->c2n[local_280->e2n[lVar29 * 2] + lVar20];
              iVar30 = local_280->c2n[(long)(int)lVar20 + (long)local_280->e2n[lVar29 * 2 + 1]];
              local_258 = (REF_DBL *)(long)iVar30;
              iVar7 = local_288->ref_mpi->id;
              lVar20 = (long)iVar28;
              if ((iVar7 == local_288->part[lVar20]) || (iVar7 == local_288->part[(long)local_258]))
              {
                uVar18 = ref_cell_list_with2(local_280,iVar28,iVar30,2,&local_1b4,&local_230);
                if (uVar18 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                         ,0x15b,"ref_inflate_face",(ulong)uVar18,"bad tri count");
                  return uVar18;
                }
                if (local_1b4 == 1) {
                  uVar18 = ref_cell_list_with2(local_1e8,iVar28,iVar30,2,&local_1b8,local_120);
                  iVar7 = local_1b8;
                  if (uVar18 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                           ,0x15e,"ref_inflate_face",(ulong)uVar18,"bad quad count");
                    return uVar18;
                  }
                  if ((long)local_1b8 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                           ,0x15f,"ref_inflate_face","tri without quad",1,(long)local_1b8);
                    local_290 = 1;
                  }
                  if (iVar7 != 1) {
                    return local_290;
                  }
                  local_108 = local_1e8->c2n[(long)local_120[0] * (long)local_1e8->size_per + 4];
                  local_110 = *(int *)((long)local_278 + (long)local_258 * 4);
                  local_10c = *(undefined4 *)((long)local_278 + lVar20 * 4);
                  local_118 = iVar28;
                  local_114 = iVar30;
                  uVar18 = ref_cell_add(local_1e8,&local_118,&local_23c);
                  if (uVar18 != 0) {
                    uVar23 = 0x165;
LAB_0019642c:
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                           ,uVar23,"ref_inflate_face",(ulong)uVar18,"qua tri1");
                    local_290 = uVar18;
                  }
                }
                else {
                  RVar19 = ref_dict_has_key(local_270,
                                            local_280->c2n
                                            [(long)local_230 * (long)local_280->size_per + 3]);
                  if ((RVar19 == 0) ||
                     (RVar19 = ref_dict_has_key(local_270,
                                                local_280->c2n
                                                [(long)local_22c * (long)local_280->size_per + 3]),
                     RVar19 != 0)) {
                    RVar19 = ref_dict_has_key(local_270,
                                              local_280->c2n
                                              [(long)local_230 * (long)local_280->size_per + 3]);
                    if ((RVar19 != 0) ||
                       (RVar19 = ref_dict_has_key(local_270,
                                                  local_280->c2n
                                                  [(long)local_22c * (long)local_280->size_per + 3])
                       , RVar19 == 0)) goto LAB_001964db;
                    local_108 = local_280->c2n[(long)local_230 * (long)local_280->size_per + 3];
                    local_110 = *(int *)((long)local_278 + (long)local_258 * 4);
                    local_10c = *(undefined4 *)((long)local_278 + lVar20 * 4);
                    local_118 = iVar28;
                    local_114 = iVar30;
                    uVar18 = ref_cell_add(local_1e8,&local_118,&local_23c);
                    if (uVar18 != 0) {
                      uVar23 = 0x179;
                      goto LAB_0019642c;
                    }
                  }
                  else {
                    local_108 = local_280->c2n[(long)local_22c * (long)local_280->size_per + 3];
                    local_110 = *(int *)((long)local_278 + (long)local_258 * 4);
                    local_10c = *(undefined4 *)((long)local_278 + lVar20 * 4);
                    local_118 = iVar28;
                    local_114 = iVar30;
                    uVar18 = ref_cell_add(local_1e8,&local_118,&local_23c);
                    if (uVar18 != 0) {
                      uVar23 = 0x16f;
                      goto LAB_0019642c;
                    }
                  }
                }
                if (uVar18 != 0) {
                  return local_290;
                }
              }
LAB_001964db:
              lVar29 = lVar29 + 1;
            } while (lVar29 != 3);
          }
          iVar28 = local_238._0_4_ + 1;
          local_238 = (REF_DBL)CONCAT44(local_238._4_4_,iVar28);
        } while (iVar28 < local_280->max);
      }
      if (0 < local_280->max) {
        iVar28 = 0;
        do {
          RVar17 = ref_cell_nodes(local_280,iVar28,local_1a8);
          if ((RVar17 == 0) && (RVar19 = ref_dict_has_key(local_270,local_19c), RVar19 != 0)) {
            local_118 = local_1a8[0];
            local_114 = local_1a8[2];
            local_110 = local_1a8[1];
            local_10c = *(undefined4 *)((long)local_278 + (long)local_1a8[0] * 4);
            local_108 = *(REF_INT *)((long)local_278 + (long)local_1a8[2] * 4);
            local_104 = *(undefined4 *)((long)local_278 + (long)local_1a8[1] * 4);
            uVar18 = ref_inflate_pri_min_dot(local_288,&local_118,&local_130);
            if (uVar18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0x18a,"ref_inflate_face",(ulong)uVar18,"md");
              return uVar18;
            }
            if (local_130 <= 0.0) {
              pRVar2 = local_288->real;
              lVar29 = (long)local_1a8[0];
              printf("min_dot %f near %f %f %f\n",SUB84(local_130,0),pRVar2[lVar29 * 0xf],
                     pRVar2[lVar29 * 0xf + 1],pRVar2[lVar29 * 0xf + 2]);
              local_260 = (void *)CONCAT44(local_260._4_4_,1);
            }
            uVar18 = ref_cell_add(local_138,&local_118,&local_23c);
            if (uVar18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0x193,"ref_inflate_face",(ulong)uVar18,"pri");
              return uVar18;
            }
          }
          iVar28 = iVar28 + 1;
        } while (iVar28 < local_280->max);
      }
      if (0 < local_280->max) {
        iVar28 = 0;
        do {
          RVar17 = ref_cell_nodes(local_280,iVar28,local_1a8);
          if ((RVar17 == 0) && (RVar19 = ref_dict_has_key(local_270,local_19c), RVar19 != 0)) {
            local_1a8[0] = *(int *)((long)local_278 + (long)local_1a8[0] * 4);
            local_1a8[1] = *(int *)((long)local_278 + (long)local_1a8[1] * 4);
            local_1a8[2] = *(int *)((long)local_278 + (long)local_1a8[2] * 4);
            uVar18 = ref_cell_replace_whole(local_280,iVar28,local_1a8);
            if (uVar18 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                     ,0x19c,"ref_inflate_face",(ulong)uVar18,"repl");
              return uVar18;
            }
          }
          iVar28 = iVar28 + 1;
        } while (iVar28 < local_280->max);
      }
      if ((REF_GLOB *)pcVar27 != (REF_GLOB *)0x0) {
        free(pcVar27);
      }
      if (local_278 != (void *)0x0) {
        free(local_278);
      }
      uVar18 = ref_gather_tec_movie_frame(local_1b0,"layer");
      if (uVar18 == 0) {
        if ((int)local_260 == 0) {
          uVar18 = 0;
        }
        else {
          puts("ERROR: inflated grid invalid, writing ref_inflate_problem.tec");
          uVar18 = ref_export_tec_surf(local_1b0,"ref_inflate_problem.tec");
          if (uVar18 == 0) {
            pcVar27 = "problem detected, examine ref_inflate_problem.tec";
            uVar23 = 0x1a8;
LAB_001969ff:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,uVar23,"ref_inflate_face",pcVar27);
LAB_00195add:
            uVar18 = 1;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,0x1a7,"ref_inflate_face",(ulong)uVar18,"tec");
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
               0x1a3,"ref_inflate_face",(ulong)uVar18,"movie frame");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             0x14f,"ref_inflate_face",(ulong)uVar18,"set new ghost node xyz");
    }
  }
  return uVar18;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_face(REF_GRID ref_grid, REF_DICT faceids,
                                    REF_DBL *origin, REF_DBL thickness,
                                    REF_DBL xshift) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_INT cell, tri_side, node0, node1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ntri, tris[2], nquad, quads[2];
  REF_INT tri_node;
  REF_INT *o2n, o2n_max;
  REF_GLOB *o2g;
  REF_GLOB global;
  REF_INT new_node, node;
  REF_INT new_cell;
  REF_DBL min_dot;

  REF_DBL normal[3], dot;
  REF_INT ref_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, ref;

  REF_DBL *ymin, *ymax, dy, y0, y1, temp;
  REF_DBL *orient;
  REF_DBL *tmin, *tmax;
  REF_INT *imin, *imax;
  REF_DBL *face_normal;
  REF_INT i;
  REF_DBL theta;

  REF_BOOL problem_detected = REF_FALSE;

  REF_BOOL debug = REF_FALSE;
  REF_BOOL verbose = REF_FALSE;

  ref_malloc_init(face_normal, 3 * ref_dict_n(faceids), REF_DBL, -1.0);

  /* determine each faceids normal, only needed if my part has a tri */

  ref_malloc_init(ymin, ref_dict_n(faceids), REF_DBL, REF_DBL_MAX);
  ref_malloc_init(ymax, ref_dict_n(faceids), REF_DBL, -REF_DBL_MAX);
  ref_malloc_init(orient, ref_dict_n(faceids), REF_DBL, 1);

  y0 = REF_DBL_MAX;
  y1 = -REF_DBL_MAX;
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        dy = ref_node_xyz(ref_node, 1, node) - origin[1];
        if (ymin[i] > dy) {
          ymin[i] = dy;
        }
        if (ymax[i] < dy) {
          ymax[i] = dy;
        }
        if (y0 > dy) {
          y0 = dy;
        }
        if (y1 < dy) {
          y1 = dy;
        }
      }
    }
  }
  temp = y0;
  RSS(ref_mpi_min(ref_mpi, &temp, &y0, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y0, 1, REF_DBL_TYPE), "bcast");
  temp = y1;
  RSS(ref_mpi_max(ref_mpi, &temp, &y1, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y1, 1, REF_DBL_TYPE), "bcast");

  if (verbose) printf("y %f %f\n", y0, y1);
  each_ref_dict_key_index(faceids, i) {
    temp = ymin[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(ymin[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymin[i]), 1, REF_DBL_TYPE), "bcast");
    temp = ymax[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(ymax[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymax[i]), 1, REF_DBL_TYPE), "bcast");
    if (y1 - ymax[i] > ymin[i] - y0) {
      orient[i] = -1.0;
    } else {
      orient[i] = 1.0;
    }
    if (verbose) printf("%d z %f %f o %f\n", i, ymin[i], ymax[i], orient[i]);
  }

  ref_malloc_init(tmin, ref_dict_n(faceids), REF_DBL, 4.0 * ref_math_pi);
  ref_malloc_init(tmax, ref_dict_n(faceids), REF_DBL, -4.0 * ref_math_pi);
  ref_malloc_init(imin, ref_dict_n(faceids), REF_INT, REF_EMPTY);
  ref_malloc_init(imax, ref_dict_n(faceids), REF_INT, REF_EMPTY);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3]))
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        theta =
            atan2((ref_node_xyz(ref_node, 2, node) - origin[2]),
                  orient[i] * (ref_node_xyz(ref_node, 1, node) - origin[1]));

        if (tmin[i] > theta) {
          tmin[i] = theta;
          imin[i] = node;
        }
        if (tmax[i] < theta) {
          tmax[i] = theta;
          imax[i] = node;
        }
      }
  }

  if (debug) ref_dict_inspect(faceids);

  each_ref_dict_key_index(faceids, i) {
    if (!ref_mpi_para(ref_mpi)) {
      RUB(REF_EMPTY, imin[i], "imin",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
      RUB(REF_EMPTY, imax[i], "imax",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
    }
    if (REF_EMPTY != imin[i] && REF_EMPTY != imax[i]) {
      face_normal[0 + 3 * i] = 0.0;
      face_normal[1 + 3 * i] = (ref_node_xyz(ref_node, 2, imax[i]) -
                                ref_node_xyz(ref_node, 2, imin[i]));
      face_normal[2 + 3 * i] = -(ref_node_xyz(ref_node, 1, imax[i]) -
                                 ref_node_xyz(ref_node, 1, imin[i]));
      face_normal[1 + 3 * i] *= -orient[i];
      face_normal[2 + 3 * i] *= -orient[i];
      if (debug)
        printf("n=(%f,%f,%f)\n", face_normal[0 + 3 * i], face_normal[1 + 3 * i],
               face_normal[2 + 3 * i]);
      RSS(ref_math_normalize(&(face_normal[3 * i])), "make face norm");
      if (verbose && ref_mpi_once(ref_mpi))
        printf(
            "f=%5d n=(%7.4f,%7.4f,%7.4f) t=(%7.4f,%7.4f) angle %7.4f"
            " or %4.1f\n",
            ref_dict_key(faceids, i), face_normal[0 + 3 * i],
            face_normal[1 + 3 * i], face_normal[2 + 3 * i], tmin[i], tmax[i],
            ABS(tmin[i] - tmax[i]), orient[i]);
    }
  }

  ref_free(imax);
  ref_free(imin);
  ref_free(tmax);
  ref_free(tmin);

  ref_free(orient);

  ref_free(ymax);
  ref_free(ymin);

  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* build list of node globals */
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        node = nodes[tri_node];
        if (ref_node_owned(ref_node, node) && REF_EMPTY == o2n[node]) {
          RSS(ref_node_next_global(ref_node, &global), "global");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          /* redundant */
          ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
          o2n[node] = new_node;
        }
      }
    }
  }

  /* sync globals */
  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(o2g, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  /* fill ghost node globals */
  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2n[node]) {
      o2g[node] = ref_node_global(ref_node, o2n[node]);
    }
  }
  RSS(ref_node_ghost_glob(ref_node, o2g, 1), "update ghosts");

  ref_free(o2n);
  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2g[node]) {
      /* returns node if already added */
      RSS(ref_node_add(ref_node, o2g[node], &new_node), "add node");
      ref_node_part(ref_node, new_node) = ref_node_part(ref_node, node);
      o2n[node] = new_node;
    }
  }

  /* create offsets */
  for (node = 0; node < o2n_max; node++) {
    if (ref_node_valid(ref_node, node)) {
      if (ref_node_owned(ref_node, node) && REF_EMPTY != o2n[node]) {
        new_node = o2n[node];
        normal[0] = 0.0;
        normal[1] = ref_node_xyz(ref_node, 1, node) - origin[1];
        normal[2] = ref_node_xyz(ref_node, 2, node) - origin[2];
        RSS(ref_math_normalize(normal), "make norm");
        each_ref_cell_having_node(tri, node, item, ref) {
          RSS(ref_cell_nodes(tri, ref, ref_nodes), "cell");
          if (!ref_dict_has_key(faceids, ref_nodes[3])) continue;
          RSS(ref_dict_location(faceids, ref_nodes[3], &i), "key loc");
          dot = -ref_math_dot(normal, &(face_normal[3 * i]));
          RAS(face_normal[0 + 3 * i] > -0.1, "uninitialized face_normal");
          if (dot < 0.70 || dot > 1.01) {
            printf("out-of-range dot %.15f at %f %f %f\n", dot,
                   ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            problem_detected = REF_TRUE;
          }
          RAB(ref_math_divisible(normal[1], dot), "normal[1] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          RAB(ref_math_divisible(normal[2], dot), "normal[2] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          normal[1] /= dot;
          normal[2] /= dot;
        }
        ref_node_xyz(ref_node, 0, new_node) =
            xshift + ref_node_xyz(ref_node, 0, node);
        ref_node_xyz(ref_node, 1, new_node) =
            thickness * normal[1] + ref_node_xyz(ref_node, 1, node);
        ref_node_xyz(ref_node, 2, new_node) =
            thickness * normal[2] + ref_node_xyz(ref_node, 2, node);
      }
    }
  }

  if (problem_detected) printf("ERROR: new node normal\n");

  RSS(ref_node_ghost_real(ref_node), "set new ghost node xyz");

  ref_free(face_normal);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_side = 0; tri_side < 3; tri_side++) {
        node0 = ref_cell_e2n(tri, 0, tri_side, cell);
        node1 = ref_cell_e2n(tri, 1, tri_side, cell);
        if (ref_node_owned(ref_node, node0) ||
            ref_node_owned(ref_node, node1)) {
          RSS(ref_cell_list_with2(tri, node0, node1, 2, &ntri, tris),
              "bad tri count");
          if (1 == ntri) {
            RSS(ref_cell_list_with2(qua, node0, node1, 2, &nquad, quads),
                "bad quad count");
            REIS(1, nquad, "tri without quad");
            new_nodes[4] = ref_cell_c2n(qua, 4, quads[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              !ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[1]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (!ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
        }
      }
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      new_nodes[0] = nodes[0];
      new_nodes[1] = nodes[2];
      new_nodes[2] = nodes[1];
      new_nodes[3] = o2n[nodes[0]];
      new_nodes[4] = o2n[nodes[2]];
      new_nodes[5] = o2n[nodes[1]];

      RSS(ref_inflate_pri_min_dot(ref_node, new_nodes, &min_dot), "md");
      if (min_dot <= 0.0) {
        printf("min_dot %f near %f %f %f\n", min_dot,
               ref_node_xyz(ref_node, 0, nodes[0]),
               ref_node_xyz(ref_node, 1, nodes[0]),
               ref_node_xyz(ref_node, 2, nodes[0]));
        problem_detected = REF_TRUE;
      }

      RSS(ref_cell_add(pri, new_nodes, &new_cell), "pri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      nodes[0] = o2n[nodes[0]];
      nodes[1] = o2n[nodes[1]];
      nodes[2] = o2n[nodes[2]];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "repl");
    }
  }

  ref_free(o2g);
  ref_free(o2n);

  ref_gather_blocking_frame(ref_grid, "layer");

  if (problem_detected) {
    printf("ERROR: inflated grid invalid, writing ref_inflate_problem.tec\n");
    RSS(ref_export_tec_surf(ref_grid, "ref_inflate_problem.tec"), "tec");
    THROW("problem detected, examine ref_inflate_problem.tec");
  }

  return REF_SUCCESS;
}